

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int attr_count(attr_list list)

{
  uint uVar1;
  int_attr_struct *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (list == (attr_list)0x0) {
    iVar4 = 0;
  }
  else if (list->list_of_lists == 0) {
    piVar2 = (list->l).list.iattrs;
    iVar4 = (uint)piVar2->other_attr_count + (uint)piVar2->int_attr_count;
  }
  else {
    uVar1 = (list->l).lists.sublist_count;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    iVar4 = 0;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar3 = attr_count((list->l).lists.lists[uVar6]);
      iVar4 = iVar4 + iVar3;
    }
  }
  return iVar4;
}

Assistant:

extern
int 
attr_count(attr_list list)
{
    if (list == NULL) return 0;
    if (!list->list_of_lists) {
        return list->l.list.iattrs->int_attr_count +
	    list->l.list.iattrs->other_attr_count;
    } else {
        int count = 0;
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            count += attr_count(list->l.lists.lists[i]);
        }
        return count;
    }           
}